

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emu2149.c
# Opt level: O3

void PSG_init(PSG_conflict *psg,UINT32 c,UINT32 r)

{
  UINT32 UVar1;
  
  memset(psg->reg,0,0x100);
  psg->voltbl = voltbl[0];
  psg->clk = c;
  UVar1 = 0xac44;
  if (r != 0) {
    UVar1 = r;
  }
  psg->rate = UVar1;
  internal_refresh(psg);
  psg->stereo_mask[0] = 3;
  psg->stereo_mask[1] = 3;
  psg->stereo_mask[2] = 3;
  return;
}

Assistant:

EMU2149_API void
PSG_init (PSG * psg, UINT32 c, UINT32 r)
{
  memset(psg, 0x00, sizeof(PSG));

  PSG_setVolumeMode (psg, EMU2149_VOL_DEFAULT);
  psg->clk = c;
  psg->rate = r ? r : 44100;
  PSG_set_quality (psg, 0);
  psg->stereo_mask[0] = 0x03;
  psg->stereo_mask[1] = 0x03;
  psg->stereo_mask[2] = 0x03;
}